

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

bool __thiscall
booster::locale::util::gregorian_calendar::same(gregorian_calendar *this,abstract_calendar *other)

{
  long in_RSI;
  long in_RDI;
  gregorian_calendar *gcal;
  bool local_39;
  long local_38;
  bool local_1;
  
  if (in_RSI == 0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(in_RSI,&abstract_calendar::typeinfo,&typeinfo,0);
  }
  if (local_38 == 0) {
    local_1 = false;
  }
  else {
    local_39 = false;
    if ((*(int *)(local_38 + 0x8c) == *(int *)(in_RDI + 0x8c)) &&
       (local_39 = false, (*(byte *)(local_38 + 0x89) & 1) == (*(byte *)(in_RDI + 0x89) & 1))) {
      local_39 = *(int *)(local_38 + 8) == *(int *)(in_RDI + 8);
    }
    local_1 = local_39;
  }
  return local_1;
}

Assistant:

virtual bool same(abstract_calendar const *other) const 
            {
                gregorian_calendar const *gcal = dynamic_cast<gregorian_calendar const *>(other);
                if(!gcal)
                    return false;
                return 
                    gcal->tzoff_ == tzoff_ 
                    && gcal->is_local_ == is_local_
                    && gcal->first_day_of_week_  == first_day_of_week_;
            }